

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_searchagain(int f,int n)

{
  int iVar1;
  int n_local;
  int f_local;
  
  if (re_srch_lastdir == -3) {
    dobeep();
    ewprintf("No last search");
    n_local = 0;
  }
  else if (re_srch_lastdir == -1) {
    iVar1 = re_forwsrch();
    if (iVar1 == 0) {
      dobeep();
      ewprintf("Search failed: \"%s\"",re_pat);
      n_local = 0;
    }
    else {
      n_local = 1;
    }
  }
  else if ((re_srch_lastdir == -2) && (iVar1 = re_backsrch(), iVar1 == 0)) {
    dobeep();
    ewprintf("Search failed: \"%s\"",re_pat);
    n_local = 0;
  }
  else {
    n_local = 1;
  }
  return n_local;
}

Assistant:

int
re_searchagain(int f, int n)
{
	if (re_srch_lastdir == SRCH_NOPR) {
		dobeep();
		ewprintf("No last search");
		return (FALSE);
	}
	if (re_srch_lastdir == SRCH_FORW) {
		if (re_forwsrch() == FALSE) {
			dobeep();
			ewprintf("Search failed: \"%s\"", re_pat);
			return (FALSE);
		}
		return (TRUE);
	}
	if (re_srch_lastdir == SRCH_BACK)
		if (re_backsrch() == FALSE) {
			dobeep();
			ewprintf("Search failed: \"%s\"", re_pat);
			return (FALSE);
		}

	return (TRUE);
}